

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_connect2cluster(void *ignore)

{
  fio_connect_args args;
  undefined1 auVar1 [40];
  undefined8 in_stack_ffffffffffffffb0;
  uint7 uStack_17;
  void *ignore_local;
  
  if (cluster_data.uuid != 0) {
    fio_force_close(cluster_data.uuid);
  }
  cluster_data.uuid = 0;
  auVar1 = ZEXT2440(CONCAT816(fio_cluster_on_fail,ZEXT816(0x12daf0) << 0x40));
  args.udata = (void *)((ulong)uStack_17 << 8);
  args.address = (char *)auVar1._0_8_;
  args.port = (char *)auVar1._8_8_;
  args.on_connect = (_func_void_intptr_t_void_ptr *)auVar1._16_8_;
  args.on_fail = (_func_void_intptr_t_void_ptr *)auVar1._24_8_;
  args.tls = (void *)auVar1._32_8_;
  args._48_8_ = in_stack_ffffffffffffffb0;
  fio_connect(args);
  return;
}

Assistant:

static void fio_connect2cluster(void *ignore) {
  if (cluster_data.uuid)
    fio_force_close(cluster_data.uuid);
  cluster_data.uuid = 0;
  /* this is called for each child, but not for single a process worker. */
  fio_connect(.address = cluster_data.name, .port = NULL,
              .on_connect = fio_cluster_on_connect,
              .on_fail = fio_cluster_on_fail);
  (void)ignore;
}